

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::mplus(Forth *this)

{
  uint valueLo;
  uint valueHi;
  anon_union_8_4_a234c5df_for_data_ local_20;
  DCell d1;
  SCell n;
  Forth *this_local;
  
  requireDStackDepth(this,3,"M+");
  d1.data_.Cells.hi = ForthStack<unsigned_int>::getTop(&this->dStack);
  valueLo = ForthStack<unsigned_int>::getTop(&this->dStack,2);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  DCell::DCell((DCell *)&local_20.Cells,valueLo,valueHi);
  ForthStack<unsigned_int>::pop(&this->dStack);
  local_20.Dcells = local_20.Dcells + (long)d1.data_.SCells.hi;
  ForthStack<unsigned_int>::setTop(&this->dStack,1,local_20.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,0,local_20.Cells.hi);
  return;
}

Assistant:

void mplus(){
			REQUIRE_DSTACK_DEPTH(3, "M+");
			SCell n(dStack.getTop());
			DCell d1(dStack.getTop(2), dStack.getTop(1));
			dStack.pop();
			d1.data_.Dcells = d1.data_.Dcells+n;
			dStack.setTop(1, d1.data_.Cells.lo);
			dStack.setTop(0, d1.data_.Cells.hi);
		}